

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

longdouble * __thiscall Vector<long_double>::operator[](Vector<long_double> *this,int i)

{
  int i_local;
  Vector<long_double> *this_local;
  
  return this->ptr_to_data + i;
}

Assistant:

inline T&   Vector< T >::operator [] (int i)
{
#ifdef DEBUG
  //    cerr << "T&   Vector< T >::operator [] (int i)" << endl;
#endif

#ifdef CHECK_SIZE
    if ( ptr_to_data == 0 ) error("Vector<>::operator[], empty array");

    if ( !( (i >= 0) && (i < num_elts) ) ) error("Vector<>::operator[], index out of bound");
#endif

    return *(ptr_to_data + i);
}